

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

FileId decompress_single(uint8_t **ptrptr)

{
  byte *pbVar1;
  FileId FVar2;
  byte bVar3;
  byte *pbVar4;
  
  bVar3 = 0;
  FVar2 = 0;
  pbVar1 = *ptrptr;
  while( true ) {
    pbVar4 = pbVar1 + 1;
    FVar2 = ((*pbVar1 & 0x7f) << (bVar3 & 0x1f)) + FVar2;
    if (-1 < (char)*pbVar1) break;
    bVar3 = bVar3 + 7;
    *ptrptr = pbVar4;
    pbVar1 = pbVar4;
  }
  *ptrptr = pbVar4;
  return FVar2;
}

Assistant:

FileId decompress_single(uint8_t **ptrptr) {
    uint32_t shift = 0;
    uint8_t *&ptr = *ptrptr;
    for (uint64_t acc = 0;; ptr++) {
        acc += (*ptr & 0x7FU) << shift;
        if ((*ptr & 0x80U) == 0) {
            ptr++;
            return acc;
        }
        shift += 7U;
    }
}